

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

void Wlc_NtkExploreMem(Wlc_Ntk_t *p,int nFrames)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Wlc_Obj_t *pWVar3;
  char *pcVar4;
  Vec_Int_t *vMemObjsClean;
  Vec_Int_t *vCollect;
  int local_28;
  int iObj;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  int nFrames_local;
  Wlc_Ntk_t *p_local;
  
  p_00 = Vec_IntStart(1000);
  p_01 = Wlc_NtkCollectMemory(p,1);
  Wlc_NtkCleanMarks(p);
  for (iObj = 0; iVar1 = Vec_IntSize(p_01), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(p_01,iObj);
    pWVar3 = Wlc_NtkObj(p,iVar1);
    *(ushort *)pWVar3 = *(ushort *)pWVar3 & 0xff7f | 0x80;
  }
  for (iObj = 0; iVar1 = Vec_IntSize(p_01), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(p_01,iObj);
    pWVar3 = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjType(pWVar3);
    if (iVar1 == 0x36) {
      Vec_IntClear(p_00);
      Wlc_NtkExploreMem_rec(p,pWVar3,p_00,nFrames);
      uVar2 = Wlc_ObjId(p,pWVar3);
      printf("Read port %6d : ",(ulong)uVar2);
      uVar2 = Vec_IntSize(p_00);
      printf("Inputs = %6d  ",(ulong)uVar2);
      for (local_28 = 0; iVar1 = Vec_IntSize(p_00), local_28 < iVar1; local_28 = local_28 + 1) {
        uVar2 = Vec_IntEntry(p_00,local_28);
        pcVar4 = Wlc_ObjName(p,uVar2);
        printf("%d(%s) ",(ulong)uVar2,pcVar4);
      }
      printf("\n");
    }
  }
  Vec_IntFree(p_01);
  Vec_IntFree(p_00);
  Wlc_NtkCleanMarks(p);
  return;
}

Assistant:

void Wlc_NtkExploreMem( Wlc_Ntk_t * p, int nFrames )
{
    Wlc_Obj_t * pObj; int i, k, iObj;
    Vec_Int_t * vCollect = Vec_IntStart( 1000 );
    Vec_Int_t * vMemObjsClean = Wlc_NtkCollectMemory( p, 1 );
    Wlc_NtkCleanMarks( p );
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
        pObj->Mark = 1;
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) != WLC_OBJ_READ )
            continue;
        Vec_IntClear( vCollect );
        Wlc_NtkExploreMem_rec( p, pObj, vCollect, nFrames );
        printf( "Read port %6d : ", Wlc_ObjId(p, pObj) );
        printf( "Inputs = %6d  ", Vec_IntSize(vCollect) );
        Vec_IntForEachEntry( vCollect, iObj, k )
            printf( "%d(%s) ", iObj, Wlc_ObjName(p, iObj) );
        printf( "\n" );
    }
    Vec_IntFree( vMemObjsClean );
    Vec_IntFree( vCollect );
    Wlc_NtkCleanMarks( p );
}